

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

Iterator * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::Iterator::
operator++(Iterator *this,int param_2)

{
  int iVar1;
  uint64_t uVar2;
  Iterator *in_RSI;
  Iterator *in_RDI;
  Iterator *tmp;
  uint64_t bit;
  uint64_t in_stack_ffffffffffffffb8;
  
  Iterator(in_RDI,in_RSI);
  do {
    if (in_RSI->cur_bitmap_data_ != 0) {
      extract_rightmost_one(in_RSI->cur_bitmap_data_);
      iVar1 = get_offset((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffb8);
      in_RSI->cur_idx_ = iVar1;
      uVar2 = remove_rightmost_one(in_RSI->cur_bitmap_data_);
      in_RSI->cur_bitmap_data_ = uVar2;
      return in_RDI;
    }
    in_RSI->cur_bitmap_idx_ = in_RSI->cur_bitmap_idx_ + 1;
    if (in_RSI->cur_leaf_->bitmap_size_ <= in_RSI->cur_bitmap_idx_) {
      in_RSI->cur_leaf_ = in_RSI->cur_leaf_->next_leaf_;
      in_RSI->cur_idx_ = 0;
      if (in_RSI->cur_leaf_ == (data_node_type *)0x0) {
        return in_RDI;
      }
      in_RSI->cur_bitmap_idx_ = 0;
    }
    in_RSI->cur_bitmap_data_ = in_RSI->cur_leaf_->bitmap_[in_RSI->cur_bitmap_idx_];
  } while( true );
}

Assistant:

Iterator operator++(int) {
      Iterator tmp = *this;
      advance();
      return tmp;
    }